

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm_init.c
# Opt level: O1

void comm_test(MPI_Comm comm)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int g_a;
  int iVar5;
  void *pvVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  char *__s;
  int iVar11;
  uint uVar12;
  bool bVar13;
  int ld;
  int hi [2];
  int lo [2];
  int rank;
  int dims [2];
  int local_5c;
  int local_58;
  int local_54;
  uint local_50;
  uint local_4c;
  ulong local_48;
  uint local_40;
  undefined1 local_3c [4];
  int local_38 [2];
  
  MPI_Comm_rank(comm,local_3c);
  iVar3 = GA_Initialize_comm(comm);
  if (iVar3 != 0) {
    uVar4 = GA_Nodeid();
    local_40 = GA_Nnodes();
    iVar3 = (int)(uVar4 + 1) % (int)local_40;
    local_48 = (ulong)uVar4;
    if (uVar4 == 0) {
      printf("\nRunning comm_test on %d processors\n\n",(ulong)local_40);
    }
    g_a = NGA_Create_handle();
    local_38[0] = 0x100;
    local_38[1] = 0x100;
    NGA_Set_data(g_a,2,local_38,0x3ec);
    NGA_Allocate(g_a);
    GA_Zero(g_a);
    NGA_Distribution(g_a,iVar3,(int *)&local_50,&local_58);
    uVar12 = local_4c;
    uVar4 = local_50;
    iVar9 = local_54;
    iVar3 = local_58;
    iVar11 = (local_54 - local_4c) + 1;
    local_5c = iVar11;
    pvVar6 = malloc((long)(int)(((local_58 - local_50) + 1) * iVar11) << 3);
    if ((int)uVar4 <= iVar3) {
      iVar5 = uVar4 * 0x100 + uVar12;
      iVar7 = 0;
      do {
        iVar8 = iVar11;
        iVar10 = iVar7;
        iVar2 = iVar5;
        if ((int)uVar12 <= iVar9) {
          do {
            *(double *)((long)pvVar6 + (long)iVar10 * 8) = (double)iVar2;
            iVar8 = iVar8 + -1;
            iVar10 = iVar10 + 1;
            iVar2 = iVar2 + 1;
          } while (iVar8 != 0);
        }
        uVar4 = uVar4 + 1;
        iVar5 = iVar5 + 0x100;
        iVar7 = iVar7 + iVar11;
      } while (iVar3 + 1U != uVar4);
    }
    NGA_Put(g_a,(int *)&local_50,&local_58,pvVar6,&local_5c);
    GA_Sync();
    free(pvVar6);
    uVar4 = local_40;
    if (0 < (int)(uint)local_48) {
      uVar4 = (uint)local_48;
    }
    NGA_Distribution(g_a,uVar4 - 1,(int *)&local_50,&local_58);
    local_5c = (local_54 - local_4c) + 1;
    uVar4 = ((local_58 - local_50) + 1) * local_5c;
    pvVar6 = malloc((long)(int)uVar4 * 8);
    if (0 < (int)uVar4) {
      memset(pvVar6,0,(ulong)uVar4 << 3);
    }
    NGA_Get(g_a,(int *)&local_50,&local_58,pvVar6,&local_5c);
    bVar1 = true;
    if ((int)local_50 <= local_58) {
      iVar3 = local_50 << 8;
      bVar1 = true;
      uVar4 = local_50;
      do {
        if ((int)local_4c <= local_54) {
          iVar9 = uVar4 - local_50;
          uVar12 = local_4c;
          do {
            if (bVar1 && (double)(int)(iVar3 + uVar12) !=
                         *(double *)
                          ((long)pvVar6 + (long)(int)((local_5c * iVar9 - local_4c) + uVar12) * 8))
            {
              printf("p[%d] Mismatch for (%d,%d) expected: %f actual: %f\n",local_48,(ulong)uVar4,
                     (ulong)uVar12);
              bVar1 = false;
            }
            bVar13 = (int)uVar12 < local_54;
            uVar12 = uVar12 + 1;
          } while (bVar13);
        }
        iVar3 = iVar3 + 0x100;
        bVar13 = (int)uVar4 < local_58;
        uVar4 = uVar4 + 1;
      } while (bVar13);
    }
    bVar13 = (int)local_48 == 0;
    free(pvVar6);
    bVar13 = (bool)(bVar13 & bVar1);
    if ((bool)(~bVar1 & 1U | bVar13)) {
      __s = "Test failed";
      if (bVar13) {
        __s = "Test passed";
      }
      puts(__s);
    }
    GA_Terminate();
  }
  return;
}

Assistant:

void comm_test(MPI_Comm comm)
{
  double *buf;
  int i, j, ii, jj, ld;
  int lo[2], hi[2];
  int dims[2];
  int two = 2;
  int g_a;
  int me, nprocs, prem;
  int nelems, ok;
  int rank;
  MPI_Comm_rank(comm,&rank);
  if (GA_Initialize_comm(comm)) {
    me = GA_Nodeid();
    nprocs = GA_Nnodes();
    prem = (me+1)%nprocs;
    if (me == 0) {
      printf("\nRunning comm_test on %d processors\n\n",nprocs);
    }

    g_a = NGA_Create_handle();
    dims[0] = DIM;
    dims[1] = DIM;
    NGA_Set_data(g_a,two,dims,C_DBL);
    NGA_Allocate(g_a);
    GA_Zero(g_a);

    /* Find out what section of global array I'm writing to */
    NGA_Distribution(g_a,prem,lo,hi);
    nelems = (hi[0]-lo[0]+1)*(hi[1]-lo[1]+1);
    ld = hi[1]-lo[1]+1;
    buf = (double*)malloc(nelems*sizeof(double));
    for (i=lo[0]; i<=hi[0]; i++) {
      ii = i-lo[0];
      for (j=lo[1]; j<=hi[1]; j++) {
        jj = j-lo[1];
        buf[ii*ld+jj] = (double)(i*DIM+j);
      }
    }
    NGA_Put(g_a,lo,hi,buf,&ld);
    GA_Sync();
    free(buf);
    /* Copy data from a different section of global array and check values */
    prem = me-1;
    if (prem < 0) prem = nprocs-1;
    NGA_Distribution(g_a,prem,lo,hi);
    nelems = (hi[0]-lo[0]+1)*(hi[1]-lo[1]+1);
    ld = hi[1]-lo[1]+1;
    buf = (double*)malloc(nelems*sizeof(double));
    for (i=0; i<nelems; i++) buf[i] = 0.0;
    NGA_Get(g_a,lo,hi,buf,&ld);

    ok = 1;
    for (i=lo[0]; i<=hi[0]; i++) {
      ii = i-lo[0];
      for (j=lo[1]; j<=hi[1]; j++) {
        jj = j-lo[1];
        if (buf[ii*ld+jj] != (double)(i*DIM+j)) {
          if (ok == 1) {
            printf("p[%d] Mismatch for (%d,%d) expected: %f actual: %f\n",
                me,i,j,buf[ii*ld+jj],(double)(i*DIM+j));
            ok = 0;
          }
        }
      }
    }
    free(buf);
    if (me == 0 && ok) {
      printf("Test passed\n");
    } else if (!ok) {
      printf("Test failed\n");
    }
    GA_Terminate();
  }
}